

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O2

void __thiscall
CTilesetMapper::Proceed(CTilesetMapper *this,CLayerTiles *pLayer,int ConfigID,RECTi Area)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  CRuleSet *pCVar5;
  CTile *pCVar6;
  CRuleCondition *pCVar7;
  int iVar8;
  CRule *pCVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long in_FS_OFFSET;
  float fVar23;
  RECTi Area_local;
  
  Area_local._8_8_ = Area._8_8_;
  Area_local._0_8_ = Area._0_8_;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < ConfigID) && ((pLayer->super_CLayer).m_Readonly == false)) &&
     (ConfigID < (this->m_aRuleSets).num_elements)) {
    pCVar5 = (this->m_aRuleSets).list;
    if (pCVar5[(uint)ConfigID].m_aRules.num_elements != 0) {
      CLayerTiles::Clamp(pLayer,&Area_local);
      iVar1 = pLayer->m_Height;
      iVar2 = pLayer->m_Width;
      iVar8 = pCVar5[(uint)ConfigID].m_BaseTile;
      for (iVar14 = Area_local.y; iVar14 < Area_local.y + Area_local.h; iVar14 = iVar14 + 1) {
        iVar20 = Area_local.x;
        for (iVar21 = Area_local.x; iVar21 < Area_local.w + iVar20; iVar21 = iVar21 + 1) {
          pCVar6 = pLayer->m_pTiles;
          iVar10 = pLayer->m_Width * iVar14 + iVar21;
          if (pCVar6[iVar10].m_Index != '\0') {
            pCVar6[iVar10].m_Index = (uchar)iVar8;
            for (lVar11 = 0; lVar11 < pCVar5[(uint)ConfigID].m_aRules.num_elements;
                lVar11 = lVar11 + 1) {
              pCVar9 = pCVar5[(uint)ConfigID].m_aRules.list;
              bVar17 = true;
              lVar15 = 8;
              lVar16 = 0;
              while ((lVar16 < pCVar9[lVar11].m_aConditions.num_elements && (bVar17))) {
                pCVar7 = pCVar9[lVar11].m_aConditions.list;
                iVar18 = *(int *)((long)pCVar7 + lVar15 + -4) + iVar14;
                iVar20 = pLayer->m_Height + -1;
                if (iVar18 < iVar20) {
                  iVar20 = iVar18;
                }
                bVar17 = false;
                if (iVar18 < 0) {
                  iVar20 = 0;
                }
                iVar22 = *(int *)((long)pCVar7 + lVar15 + -8) + iVar21;
                iVar18 = pLayer->m_Width + -1;
                if (iVar22 < iVar18) {
                  iVar18 = iVar22;
                }
                if (iVar22 < 0) {
                  iVar18 = 0;
                }
                uVar19 = iVar18 + iVar20 * pLayer->m_Width;
                if ((-1 < (int)uVar19) && ((int)uVar19 < iVar1 * iVar2)) {
                  uVar3 = *(uint *)((long)&pCVar7->m_X + lVar15);
                  uVar19 = (uint)pLayer->m_pTiles[uVar19].m_Index;
                  if (uVar3 < 0xfffffffe) {
                    bVar17 = uVar3 == uVar19;
                  }
                  else {
                    bVar17 = (uVar3 != 0xffffffff || uVar19 != 0) &&
                             (uVar3 != 0xfffffffe || uVar19 == 0);
                  }
                }
                lVar16 = lVar16 + 1;
                lVar15 = lVar15 + 0xc;
              }
              if (bVar17) {
                if (1 < pCVar9[lVar11].m_Random) {
                  fVar23 = random_float();
                  pCVar9 = pCVar5[(uint)ConfigID].m_aRules.list;
                  if ((int)((float)pCVar9[lVar11].m_Random * fVar23) != 1) goto LAB_00181f54;
                }
                pCVar6[iVar10].m_Index = (uchar)pCVar9[lVar11].m_Index;
                pCVar6[iVar10].m_Flags = '\0';
                iVar20 = pCVar9[lVar11].m_Rotation;
                bVar12 = 2;
                if (iVar20 == 0x5a) {
                  bVar13 = 8;
LAB_00181f22:
                  pCVar6[iVar10].m_Flags = bVar13;
                }
                else {
                  if (iVar20 == 0x10e) {
                    bVar13 = 0xb;
                    goto LAB_00181f22;
                  }
                  bVar12 = 1;
                  if (iVar20 == 0xb4) {
                    bVar13 = 3;
                    bVar12 = 1;
                    goto LAB_00181f22;
                  }
                  bVar13 = 0;
                }
                if (pCVar9[lVar11].m_HFlip != 0) {
                  bVar13 = bVar12 ^ bVar13;
                  pCVar6[iVar10].m_Flags = bVar13;
                }
                if (pCVar9[lVar11].m_VFlip != 0) {
                  pCVar6[iVar10].m_Flags = ((bVar13 & 8) == 0) + 1U ^ bVar13;
                }
              }
LAB_00181f54:
            }
            iVar20 = Area_local.x;
          }
        }
      }
      (((this->super_IAutoMapper).m_pEditor)->m_Map).m_Modified = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTilesetMapper::Proceed(CLayerTiles *pLayer, int ConfigID, RECTi Area)
{
	if(pLayer->m_Readonly || ConfigID < 0 || ConfigID >= m_aRuleSets.size())
		return;

	CRuleSet *pConf = &m_aRuleSets[ConfigID];

	if(!pConf->m_aRules.size())
		return;

	pLayer->Clamp(&Area);
	
	int BaseTile = pConf->m_BaseTile;

	// auto map !
	int MaxIndex = pLayer->m_Width*pLayer->m_Height;
	for(int y = Area.y; y < Area.y + Area.h; y++)
		for(int x = Area.x; x < Area.x + Area.w; x++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);
			if(pTile->m_Index == 0)
				continue;

			pTile->m_Index = BaseTile;

			for(int i = 0; i < pConf->m_aRules.size(); ++i)
			{
				bool RespectRules = true;
				for(int j = 0; j < pConf->m_aRules[i].m_aConditions.size() && RespectRules; ++j)
				{
					CRuleCondition *pCondition = &pConf->m_aRules[i].m_aConditions[j];
					int CheckIndex = clamp((y+pCondition->m_Y), 0, pLayer->m_Height-1)*pLayer->m_Width+clamp((x+pCondition->m_X), 0, pLayer->m_Width-1);

					if(CheckIndex < 0 || CheckIndex >= MaxIndex)
						RespectRules = false;
					else
					{
 						if(pCondition->m_Value == CRuleCondition::EMPTY || pCondition->m_Value == CRuleCondition::FULL)
						{
							if(pLayer->m_pTiles[CheckIndex].m_Index > 0 && pCondition->m_Value == CRuleCondition::EMPTY)
								RespectRules = false;

							if(pLayer->m_pTiles[CheckIndex].m_Index == 0 && pCondition->m_Value == CRuleCondition::FULL)
								RespectRules = false;
						}
						else
						{
							if(pLayer->m_pTiles[CheckIndex].m_Index != pCondition->m_Value)
								RespectRules = false;
						}
					}
				}

				if(RespectRules && (pConf->m_aRules[i].m_Random <= 1 || (int)(random_float() * pConf->m_aRules[i].m_Random) == 1))
				{
					pTile->m_Index = pConf->m_aRules[i].m_Index;
					pTile->m_Flags = 0;

					// rotate
					if(pConf->m_aRules[i].m_Rotation == 90)
						pTile->m_Flags ^= TILEFLAG_ROTATE;
					else if(pConf->m_aRules[i].m_Rotation == 180)
						pTile->m_Flags ^= (TILEFLAG_HFLIP|TILEFLAG_VFLIP);
					else if(pConf->m_aRules[i].m_Rotation == 270)
						pTile->m_Flags ^= (TILEFLAG_HFLIP|TILEFLAG_VFLIP|TILEFLAG_ROTATE);

					// flip
					if(pConf->m_aRules[i].m_HFlip)
						pTile->m_Flags ^= pTile->m_Flags&TILEFLAG_ROTATE ? TILEFLAG_HFLIP : TILEFLAG_VFLIP;
					if(pConf->m_aRules[i].m_VFlip)
						pTile->m_Flags ^= pTile->m_Flags&TILEFLAG_ROTATE ? TILEFLAG_VFLIP : TILEFLAG_HFLIP;
				}
			}
		}

	m_pEditor->m_Map.m_Modified = true;
}